

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937sampler.hpp
# Opt level: O0

vec3f __thiscall MT19937Sampler::sampleUnitSphereSurface(MT19937Sampler *this)

{
  bool bVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  data_t dVar2;
  vec3f vVar3;
  vec3f local_38;
  undefined1 local_2c [8];
  vec3f v;
  MT19937Sampler *this_local;
  
  v._4_8_ = this;
  vec3f::vec3f((vec3f *)local_2c);
  do {
    (**(this->super_Sampler)._vptr_Sampler)();
    (**(this->super_Sampler)._vptr_Sampler)();
    (**(this->super_Sampler)._vptr_Sampler)();
    vec3f::vec3f(&local_38,extraout_XMM0_Da + extraout_XMM0_Da + -1.0,
                 extraout_XMM0_Da_00 + extraout_XMM0_Da_00 + -1.0,
                 extraout_XMM0_Da_01 + extraout_XMM0_Da_01 + -1.0);
    local_2c._0_4_ = local_38.x;
    local_2c._4_4_ = local_38.y;
    v.x = local_38.z;
    dVar2 = norm((vec3f *)local_2c);
    bVar1 = true;
    if (dVar2 <= 1.0) {
      dVar2 = norm((vec3f *)local_2c);
      bVar1 = dVar2 < 0.001;
    }
  } while (bVar1);
  vVar3 = normalized((vec3f *)local_2c);
  return vVar3;
}

Assistant:

vec3f sampleUnitSphereSurface() {
		// TODO optimize
		vec3f v;
		do v = vec3f(get1f()*2-1, get1f()*2-1, get1f()*2-1);
		while (norm(v)>1 || norm(v)<1e-3);
		return normalized(v);
	}